

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall filesystem::path::stem_abi_cxx11_(path *this)

{
  ulong uVar1;
  allocator local_39;
  undefined1 local_38 [8];
  string name;
  path *this_local;
  
  filename_abi_cxx11_((path *)local_38);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::find_last_of(local_38,0x10e58c);
    std::__cxx11::string::substr((ulong)this,(ulong)local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

std::string stem() const {
        std::string name = filename();
        if (name.empty())
            return "";
        return name.substr(0, name.find_last_of("."));
    }